

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_exit_code(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 *extraout_RDX;
  undefined8 unaff_RBX;
  int64_t eval_b;
  int64_t eval_a;
  uv_stdio_container_t uStack_130;
  undefined4 uStack_120;
  undefined1 *puStack_118;
  undefined1 auStack_110 [232];
  undefined8 uStack_28;
  
  init_process_options("spawn_helper1",exit_cb);
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_001bedef;
    if (exit_cb_called != 1) goto LAB_001bedfc;
    if (close_cb_called != 1) goto LAB_001bee09;
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_exit_code_cold_1();
LAB_001bedef:
    run_test_spawn_exit_code_cold_2();
LAB_001bedfc:
    run_test_spawn_exit_code_cold_3();
LAB_001bee09:
    run_test_spawn_exit_code_cold_4();
  }
  run_test_spawn_exit_code_cold_5();
  uStack_28 = unaff_RBX;
  init_process_options("spawn_helper2",exit_cb);
  uVar2 = uv_default_loop();
  uv_pipe_init(uVar2,auStack_110,0);
  options.stdio = &uStack_130;
  uStack_130.flags = UV_IGNORE;
  uStack_120 = 0x21;
  options.stdio_count = 2;
  puStack_118 = auStack_110;
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  if (iVar1 == 0) {
    iVar1 = uv_read_start(auStack_110,on_alloc,on_read);
    if (iVar1 != 0) goto LAB_001bf011;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_001bf01e;
    if (exit_cb_called != 1) goto LAB_001bf02b;
    if (close_cb_called != 2) goto LAB_001bf038;
    printf("output is: %s",output);
    iVar1 = strcmp("hello world\n",output);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001bf052;
    }
  }
  else {
    run_test_spawn_stdout_cold_1();
LAB_001bf011:
    run_test_spawn_stdout_cold_2();
LAB_001bf01e:
    run_test_spawn_stdout_cold_3();
LAB_001bf02b:
    run_test_spawn_stdout_cold_4();
LAB_001bf038:
    run_test_spawn_stdout_cold_5();
  }
  run_test_spawn_stdout_cold_6();
LAB_001bf052:
  run_test_spawn_stdout_cold_7();
  iVar1 = output_used;
  lVar3 = (long)output_used;
  *extraout_RDX = output + lVar3;
  extraout_RDX[1] = 0x400 - lVar3;
  return iVar1;
}

Assistant:

TEST_IMPL(spawn_exit_code) {
  int r;

  init_process_options("spawn_helper1", exit_cb);

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}